

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  long *plVar1;
  Result RVar2;
  TokenType TVar3;
  Enum EVar4;
  Token local_140;
  Var local_f0;
  _Alloc_hider _Stack_a8;
  string name;
  undefined1 auStack_58 [8];
  Location loc;
  long *local_30;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_> field
  ;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&stack0xffffffffffffff58,this);
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       name.field_2._M_allocated_capacity;
  auStack_58 = (undefined1  [8])_Stack_a8._M_p;
  loc.filename.data_ = name._M_dataplus._M_p;
  Token::~Token((Token *)&stack0xffffffffffffff58);
  RVar2 = Expect(this,Elem);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  _Stack_a8._M_p = (pointer)&name._M_string_length;
  ParseBindVarOpt(this,(string *)&stack0xffffffffffffff58);
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_30,(Location *)auStack_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff58);
  TVar3 = Peek(this,0);
  plVar1 = local_30;
  if (TVar3 == Passive) {
    Consume(&local_140,this);
    Token::~Token(&local_140);
    *(undefined1 *)(local_30 + 0x15) = 1;
  }
  else {
    Var::Var(&local_f0,0,(Location *)auStack_58);
    ParseVarOpt(this,(Var *)(plVar1 + 0xc),&local_f0);
    Var::~Var(&local_f0);
    RVar2 = ParseOffsetExpr(this,(ExprList *)(local_30 + 0x16));
    EVar4 = Error;
    if (RVar2.enum_ == Error) goto LAB_00f6f89c;
  }
  EVar4 = Error;
  ParseVarListOpt(this,(VarVector *)(local_30 + 0x19));
  RVar2 = Expect(this,Rpar);
  if (RVar2.enum_ != Error) {
    loc.field_1._8_8_ = local_30;
    local_30 = (long *)0x0;
    Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                *)((long)&loc.field_1 + 8));
    if (loc.field_1._8_8_ != 0) {
      (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
    }
    loc.field_1._8_8_ = 0;
    EVar4 = Ok;
  }
LAB_00f6f89c:
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  if ((size_type *)_Stack_a8._M_p != &name._M_string_length) {
    operator_delete(_Stack_a8._M_p);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<ElemSegmentModuleField>(loc, name);

  if (Peek() == TokenType::Passive) {
    Consume();
    field->elem_segment.passive = true;
  } else {
    ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }
  ParseVarListOpt(&field->elem_segment.vars);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}